

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat3 * dja::mat3::rotation(mat3 *__return_storage_ptr__,vec3 *axis,float_t rad)

{
  float fVar1;
  quaternion local_20;
  
  fVar1 = cosf(rad * 0.5);
  local_20.im.z = sinf(rad * 0.5);
  local_20.im.x = axis->x * local_20.im.z;
  local_20.im.y = axis->y * local_20.im.z;
  local_20.im.z = local_20.im.z * axis->z;
  local_20.re = fVar1;
  rotation(&local_20);
  return __return_storage_ptr__;
}

Assistant:

mat3 mat3::rotation(const vec3& axis, float_t rad)
{
    return rotation(quaternion::rotation(axis, rad));
}